

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool duckdb::MultiplyPropagateStatistics::Operation<short,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  int64_t in_RDI;
  short result;
  idx_t r;
  idx_t l;
  short max;
  short min;
  short rvals [2];
  short lvals [2];
  Value *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int16_t in_stack_ffffffffffffff34;
  int16_t in_stack_ffffffffffffff36;
  BaseStatistics *in_stack_ffffffffffffff80;
  short local_52;
  ulong local_50;
  ulong local_48;
  short local_3c;
  short local_3a;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  NumericStats::GetMin<short>(in_stack_ffffffffffffff80);
  NumericStats::GetMax<short>(in_stack_ffffffffffffff80);
  NumericStats::GetMin<short>(in_stack_ffffffffffffff80);
  NumericStats::GetMax<short>(in_stack_ffffffffffffff80);
  local_3a = NumericLimits<short>::Maximum();
  local_3c = NumericLimits<short>::Minimum();
  local_48 = 0;
  do {
    if (1 < local_48) {
      Value::Numeric((LogicalType *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
      Value::operator=((Value *)CONCAT26(in_stack_ffffffffffffff36,
                                         CONCAT24(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30)),
                       in_stack_ffffffffffffff28);
      Value::~Value((Value *)CONCAT26(in_stack_ffffffffffffff36,
                                      CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
                   );
      Value::Numeric((LogicalType *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
      Value::operator=((Value *)CONCAT26(in_stack_ffffffffffffff36,
                                         CONCAT24(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30)),
                       in_stack_ffffffffffffff28);
      Value::~Value((Value *)CONCAT26(in_stack_ffffffffffffff36,
                                      CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
                   );
      return false;
    }
    for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
      bVar1 = TryDecimalMultiply::Operation<short,short,short>
                        (in_stack_ffffffffffffff36,in_stack_ffffffffffffff34,
                         (int16_t *)in_stack_ffffffffffffff28);
      if (!bVar1) {
        return true;
      }
      if (local_52 < local_3a) {
        local_3a = local_52;
      }
      if (local_3c < local_52) {
        local_3c = local_52;
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}